

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O0

void jpeg_fdct_3x3(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  byte *pbVar9;
  long lVar10;
  uint in_EDX;
  long in_RSI;
  int *in_RDI;
  int ctr;
  JSAMPROW elemptr;
  DCTELEM *dataptr;
  INT32 tmp2;
  INT32 tmp1;
  INT32 tmp0;
  int local_44;
  int *local_38;
  
  memset(in_RDI,0,0x100);
  local_38 = in_RDI;
  for (local_44 = 0; local_44 < 3; local_44 = local_44 + 1) {
    pbVar9 = (byte *)(*(long *)(in_RSI + (long)local_44 * 8) + (ulong)in_EDX);
    bVar1 = *pbVar9;
    bVar2 = pbVar9[2];
    uVar8 = (uint)pbVar9[1];
    bVar3 = *pbVar9;
    bVar4 = pbVar9[2];
    *local_38 = ((uint)bVar1 + (uint)bVar2 + uVar8 + -0x180) * 0x10;
    local_38[2] = (int)((((long)(int)((uint)bVar1 + (uint)bVar2) - (long)(int)uVar8) -
                        (long)(int)uVar8) * 0x16a1 + 0x100 >> 9);
    local_38[1] = (int)((long)(int)((uint)bVar3 - (uint)bVar4) * 0x2731 + 0x100 >> 9);
    local_38 = local_38 + 8;
  }
  local_38 = in_RDI;
  for (local_44 = 0; local_44 < 3; local_44 = local_44 + 1) {
    iVar5 = *local_38;
    lVar10 = (long)local_38[8];
    iVar6 = *local_38;
    iVar7 = local_38[0x10];
    *local_38 = (int)(((iVar5 + local_38[0x10]) + lVar10) * 0x38e4 + 0x4000 >> 0xf);
    local_38[0x10] = (int)((((iVar5 + local_38[0x10]) - lVar10) - lVar10) * 0x283a + 0x4000 >> 0xf);
    local_38[8] = (int)((long)(iVar6 - iVar7) * 0x45ad + 0x4000 >> 0xf);
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_3x3 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pre-zero output coefficient block. */
  MEMZERO(data, SIZEOF(DCTELEM) * DCTSIZE2);

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */
  /* We scale the results further by 2**2 as part of output adaption */
  /* scaling for different DCT size. */
  /* cK represents sqrt(2) * cos(K*pi/6). */

  dataptr = data;
  for (ctr = 0; ctr < 3; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[2]);
    tmp1 = GETJSAMPLE(elemptr[1]);

    tmp2 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[2]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp0 + tmp1 - 3 * CENTERJSAMPLE) << (PASS1_BITS+2));
    dataptr[2] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0 - tmp1 - tmp1, FIX(0.707106781)), /* c2 */
	      CONST_BITS-PASS1_BITS-2);

    /* Odd part */

    dataptr[1] = (DCTELEM)
      DESCALE(MULTIPLY(tmp2, FIX(1.224744871)),               /* c1 */
	      CONST_BITS-PASS1_BITS-2);

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   * We must also scale the output by (8/3)**2 = 64/9, which we partially
   * fold into the constant multipliers (other part was done in pass 1):
   * cK now represents sqrt(2) * cos(K*pi/6) * 16/9.
   */

  dataptr = data;
  for (ctr = 0; ctr < 3; ctr++) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*2];
    tmp1 = dataptr[DCTSIZE*1];

    tmp2 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*2];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0 + tmp1, FIX(1.777777778)),        /* 16/9 */
	      CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*2] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0 - tmp1 - tmp1, FIX(1.257078722)), /* c2 */
	      CONST_BITS+PASS1_BITS);

    /* Odd part */

    dataptr[DCTSIZE*1] = (DCTELEM)
      DESCALE(MULTIPLY(tmp2, FIX(2.177324216)),               /* c1 */
	      CONST_BITS+PASS1_BITS);

    dataptr++;			/* advance pointer to next column */
  }
}